

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::MultiAggregationPS::execute
          (MultiAggregationPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  bool bVar15;
  int iVar16;
  long lVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  cpp_dec_float<100U,_int,_void> *pcVar19;
  long lVar20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<100U,_int,_void> local_2d8;
  cpp_dec_float<100U,_int,_void> local_288;
  cpp_dec_float<100U,_int,_void> local_238;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1e0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_1d0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  fpclass_type local_178;
  int32_t iStack_174;
  undefined8 uStack_170;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148;
  uint uStack_144;
  uint uStack_140;
  uint uStack_13c;
  uint local_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  iVar16 = this->m_i;
  iVar4 = this->m_old_i;
  if (iVar16 != iVar4) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = *(undefined8 *)&pnVar5[iVar16].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)puVar2;
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar9;
    *(undefined8 *)(puVar2 + 2) = uVar10;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar16].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar16].m_backend.neg;
    iVar14 = pnVar5[iVar16].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar16].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    iVar16 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_i;
    uVar7 = *(undefined8 *)&pnVar5[iVar16].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)puVar2;
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar9;
    *(undefined8 *)(puVar2 + 2) = uVar10;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar16].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar16].m_backend.neg;
    iVar14 = pnVar5[iVar16].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar16].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar16 = this->m_j;
  iVar4 = this->m_old_j;
  if (iVar16 != iVar4) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = *(undefined8 *)&pnVar5[iVar16].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)puVar2;
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar9;
    *(undefined8 *)(puVar2 + 2) = uVar10;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar16].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar16].m_backend.neg;
    iVar14 = pnVar5[iVar16].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar16].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    iVar16 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_j;
    uVar9 = *(undefined8 *)&pnVar5[iVar16].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 4;
    uVar7 = *(undefined8 *)puVar2;
    uVar8 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar7;
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar9;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar16].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar16].m_backend.neg;
    iVar14 = pnVar5[iVar16].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar16].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  local_1e0 = s;
  local_1d8 = r;
  local_1d0 = cStatus;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_128,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar16 = (this->m_row).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar16) {
    lVar20 = 0;
    lVar17 = 0;
    do {
      pNVar6 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar4 = *(int *)((long)(&pNVar6->val + 1) + lVar20);
      if (iVar4 != this->m_j) {
        pcVar18 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar4].m_backend;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)(pNVar6->val).m_backend.data._M_elems + lVar20);
        local_2d8.fpclass = cpp_dec_float_finite;
        local_2d8.prec_elem = 0x10;
        local_2d8.data._M_elems[0] = 0;
        local_2d8.data._M_elems[1] = 0;
        local_2d8.data._M_elems[2] = 0;
        local_2d8.data._M_elems[3] = 0;
        local_2d8.data._M_elems[4] = 0;
        local_2d8.data._M_elems[5] = 0;
        local_2d8.data._M_elems[6] = 0;
        local_2d8.data._M_elems[7] = 0;
        local_2d8.data._M_elems[8] = 0;
        local_2d8.data._M_elems[9] = 0;
        local_2d8.data._M_elems[10] = 0;
        local_2d8.data._M_elems[0xb] = 0;
        local_2d8.data._M_elems[0xc] = 0;
        local_2d8.data._M_elems[0xd] = 0;
        local_2d8.data._M_elems._56_5_ = 0;
        local_2d8.data._M_elems[0xf]._1_3_ = 0;
        local_2d8.exp = 0;
        local_2d8.neg = false;
        pcVar19 = pcVar1;
        if ((&local_2d8 != pcVar18) && (pcVar19 = pcVar18, pcVar1 != &local_2d8)) {
          local_2d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_2d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_2d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          local_2d8.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_2d8.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_2d8.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
          local_2d8.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
          uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
          local_2d8.data._M_elems._56_5_ = SUB85(uVar7,0);
          local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_2d8.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar20);
          local_2d8.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar20 + 4);
          local_2d8._72_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar20 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_2d8,pcVar19);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_128,&local_2d8);
        iVar16 = (this->m_row).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar17 = lVar17 + 1;
      lVar20 = lVar20 + 0x54;
    } while (lVar17 < iVar16);
  }
  local_2d8.data._M_elems._0_8_ = *(undefined8 *)(this->m_const).m_backend.data._M_elems;
  local_2d8.data._M_elems._8_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 2);
  local_2d8.data._M_elems._16_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 4);
  local_2d8.data._M_elems._24_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 6);
  local_2d8.data._M_elems._32_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 8);
  local_2d8.data._M_elems._40_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 10);
  local_2d8.data._M_elems._48_8_ = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 0xc);
  uVar7 = *(undefined8 *)((this->m_const).m_backend.data._M_elems + 0xe);
  local_2d8.data._M_elems._56_5_ = SUB85(uVar7,0);
  local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_2d8.exp = (this->m_const).m_backend.exp;
  local_2d8.neg = (this->m_const).m_backend.neg;
  local_2d8.fpclass = (this->m_const).m_backend.fpclass;
  local_2d8.prec_elem = (this->m_const).m_backend.prec_elem;
  if ((local_2d8.neg == true) &&
     (local_2d8.data._M_elems[0] != 0 || local_2d8.fpclass != cpp_dec_float_finite)) {
    local_2d8.neg = false;
  }
  uVar7._5_3_ = local_128.data._M_elems[0xf]._1_3_;
  uVar7._0_5_ = local_128.data._M_elems._56_5_;
  local_238.data._M_elems[0xc] = local_128.data._M_elems[0xc];
  local_238.data._M_elems[0xd] = local_128.data._M_elems[0xd];
  local_238.data._M_elems[0xe] = local_128.data._M_elems[0xe];
  local_238.data._M_elems[0xf] = SUB84(uVar7,4);
  local_238.data._M_elems[8] = local_128.data._M_elems[8];
  local_238.data._M_elems[9] = local_128.data._M_elems[9];
  local_238.data._M_elems[10] = local_128.data._M_elems[10];
  local_238.data._M_elems[0xb] = local_128.data._M_elems[0xb];
  local_238.data._M_elems[4] = local_128.data._M_elems[4];
  local_238.data._M_elems[5] = local_128.data._M_elems[5];
  local_238.data._M_elems[6] = local_128.data._M_elems[6];
  local_238.data._M_elems[7] = local_128.data._M_elems[7];
  local_238.data._M_elems[0] = local_128.data._M_elems[0];
  local_238.data._M_elems[1] = local_128.data._M_elems[1];
  uVar7 = local_238.data._M_elems._0_8_;
  local_238.data._M_elems[2] = local_128.data._M_elems[2];
  local_238.data._M_elems[3] = local_128.data._M_elems[3];
  local_238.exp = local_128.exp;
  local_238.neg = local_128.neg;
  local_238.fpclass = local_128.fpclass;
  local_238.prec_elem = local_128.prec_elem;
  local_1c8.fpclass = local_128.fpclass;
  if ((local_128.neg != false) &&
     (local_238.data._M_elems[0] = local_128.data._M_elems[0],
     local_1c8.fpclass != cpp_dec_float_finite || local_238.data._M_elems[0] != 0)) {
    local_238.neg = (bool)(local_128.neg ^ 1);
  }
  local_238.data._M_elems._0_8_ = uVar7;
  if (local_1c8.fpclass != cpp_dec_float_NaN && local_2d8.fpclass != cpp_dec_float_NaN) {
    iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_2d8,&local_238);
    if (0 < iVar16) {
      pcVar1 = &local_2d8;
      local_1c8.data._M_elems[0xf]._1_3_ = local_2d8.data._M_elems[0xf]._1_3_;
      local_1c8.data._M_elems._56_5_ = local_2d8.data._M_elems._56_5_;
      local_1c8.data._M_elems[0xc] = local_2d8.data._M_elems[0xc];
      local_1c8.data._M_elems[0xd] = local_2d8.data._M_elems[0xd];
      local_1c8.data._M_elems[8] = local_2d8.data._M_elems[8];
      local_1c8.data._M_elems[9] = local_2d8.data._M_elems[9];
      local_1c8.data._M_elems[10] = local_2d8.data._M_elems[10];
      local_1c8.data._M_elems[0xb] = local_2d8.data._M_elems[0xb];
      local_1c8.data._M_elems[4] = local_2d8.data._M_elems[4];
      local_1c8.data._M_elems[5] = local_2d8.data._M_elems[5];
      local_1c8.data._M_elems[6] = local_2d8.data._M_elems[6];
      local_1c8.data._M_elems[7] = local_2d8.data._M_elems[7];
      local_1c8.data._M_elems[0] = local_2d8.data._M_elems[0];
      local_1c8.data._M_elems[1] = local_2d8.data._M_elems[1];
      local_1c8.data._M_elems[2] = local_2d8.data._M_elems[2];
      local_1c8.data._M_elems[3] = local_2d8.data._M_elems[3];
      local_1c8.exp = local_2d8.exp;
      local_1c8.neg = local_2d8.neg;
      local_1c8.fpclass = local_2d8.fpclass;
      goto LAB_004456a3;
    }
    local_1c8.fpclass = local_238.fpclass;
  }
  pcVar1 = &local_238;
  local_1c8.data._M_elems[0xc] = local_238.data._M_elems[0xc];
  local_1c8.data._M_elems[0xd] = local_238.data._M_elems[0xd];
  local_1c8.data._M_elems[0xe] = local_238.data._M_elems[0xe];
  local_1c8.data._M_elems[0xf] = local_238.data._M_elems[0xf];
  local_1c8.data._M_elems[8] = local_238.data._M_elems[8];
  local_1c8.data._M_elems[9] = local_238.data._M_elems[9];
  local_1c8.data._M_elems[10] = local_238.data._M_elems[10];
  local_1c8.data._M_elems[0xb] = local_238.data._M_elems[0xb];
  local_1c8.data._M_elems[4] = local_238.data._M_elems[4];
  local_1c8.data._M_elems[5] = local_238.data._M_elems[5];
  local_1c8.data._M_elems[6] = local_238.data._M_elems[6];
  local_1c8.data._M_elems[7] = local_238.data._M_elems[7];
  local_1c8.data._M_elems[0] = local_238.data._M_elems[0];
  local_1c8.data._M_elems[1] = local_238.data._M_elems[1];
  local_1c8.data._M_elems[2] = local_238.data._M_elems[2];
  local_1c8.data._M_elems[3] = local_238.data._M_elems[3];
  local_1c8.exp = local_238.exp;
  local_1c8.neg = local_238.neg;
LAB_004456a3:
  local_1c8.prec_elem = pcVar1->prec_elem;
  if (local_1c8.fpclass != cpp_dec_float_NaN) {
    local_2d8.fpclass = cpp_dec_float_finite;
    local_2d8.prec_elem = 0x10;
    local_2d8.data._M_elems[0] = 0;
    local_2d8.data._M_elems[1] = 0;
    local_2d8.data._M_elems[2] = 0;
    local_2d8.data._M_elems[3] = 0;
    local_2d8.data._M_elems[4] = 0;
    local_2d8.data._M_elems[5] = 0;
    local_2d8.data._M_elems[6] = 0;
    local_2d8.data._M_elems[7] = 0;
    local_2d8.data._M_elems[8] = 0;
    local_2d8.data._M_elems[9] = 0;
    local_2d8.data._M_elems[10] = 0;
    local_2d8.data._M_elems[0xb] = 0;
    local_2d8.data._M_elems[0xc] = 0;
    local_2d8.data._M_elems[0xd] = 0;
    local_2d8.data._M_elems._56_5_ = 0;
    local_2d8.data._M_elems[0xf]._1_3_ = 0;
    local_2d8.exp = 0;
    local_2d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_2d8,1.0);
    iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_1c8,&local_2d8);
    if (iVar16 < 0) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_1c8,1.0);
    }
  }
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems._56_5_ = 0;
  local_2d8.data._M_elems[0xf]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2d8,&(this->m_const).m_backend,&local_1c8);
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 0x10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.data._M_elems[10] = 0;
  local_288.data._M_elems[0xb] = 0;
  local_288.data._M_elems[0xc] = 0;
  local_288.data._M_elems[0xd] = 0;
  local_288.data._M_elems._56_5_ = 0;
  local_288.data._M_elems[0xf]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_288,&local_128,&local_1c8);
  local_238.data._M_elems[0xf]._1_3_ = local_2d8.data._M_elems[0xf]._1_3_;
  local_238.data._M_elems._56_5_ = local_2d8.data._M_elems._56_5_;
  local_238.data._M_elems[0xc] = local_2d8.data._M_elems[0xc];
  local_238.data._M_elems[0xd] = local_2d8.data._M_elems[0xd];
  local_238.data._M_elems[8] = local_2d8.data._M_elems[8];
  local_238.data._M_elems[9] = local_2d8.data._M_elems[9];
  local_238.data._M_elems[10] = local_2d8.data._M_elems[10];
  local_238.data._M_elems[0xb] = local_2d8.data._M_elems[0xb];
  local_238.data._M_elems[4] = local_2d8.data._M_elems[4];
  local_238.data._M_elems[5] = local_2d8.data._M_elems[5];
  local_238.data._M_elems[6] = local_2d8.data._M_elems[6];
  local_238.data._M_elems[7] = local_2d8.data._M_elems[7];
  local_238.data._M_elems[0] = local_2d8.data._M_elems[0];
  local_238.data._M_elems[1] = local_2d8.data._M_elems[1];
  local_238.data._M_elems[2] = local_2d8.data._M_elems[2];
  local_238.data._M_elems[3] = local_2d8.data._M_elems[3];
  local_238.exp = local_2d8.exp;
  local_238.neg = local_2d8.neg;
  local_238.fpclass = local_2d8.fpclass;
  local_238.prec_elem = local_2d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_238,&local_288)
  ;
  uVar8 = local_238._72_8_;
  bVar15 = local_238.neg;
  iVar16 = local_238.exp;
  local_168[0] = local_238.data._M_elems[0];
  local_168[1] = local_238.data._M_elems[1];
  auStack_160[0] = local_238.data._M_elems[2];
  auStack_160[1] = local_238.data._M_elems[3];
  local_158[0] = local_238.data._M_elems[4];
  local_158[1] = local_238.data._M_elems[5];
  auStack_150[0] = local_238.data._M_elems[6];
  auStack_150[1] = local_238.data._M_elems[7];
  local_148 = local_238.data._M_elems[8];
  uStack_144 = local_238.data._M_elems[9];
  uStack_140 = local_238.data._M_elems[10];
  uStack_13c = local_238.data._M_elems[0xb];
  local_138 = local_238.data._M_elems[0xc];
  uStack_134 = local_238.data._M_elems[0xd];
  uStack_130 = local_238.data._M_elems[0xe];
  uStack_12c = local_238.data._M_elems[0xf];
  local_178 = local_238.fpclass;
  iStack_174 = local_238.prec_elem;
  uStack_170 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_d0,this);
  uVar9 = local_238._72_8_;
  local_2d8.data._M_elems[9] = uStack_144;
  local_2d8.data._M_elems[8] = local_148;
  local_2d8.data._M_elems[0xb] = uStack_13c;
  local_2d8.data._M_elems[10] = uStack_140;
  local_2d8.data._M_elems[0xd] = uStack_134;
  local_2d8.data._M_elems[0xc] = local_138;
  local_2d8.data._M_elems._56_5_ = SUB85(CONCAT44(uStack_12c,uStack_130),0);
  local_2d8.data._M_elems[0xf]._1_3_ = (undefined3)(uStack_12c >> 8);
  local_2d8.data._M_elems[4] = local_158[0];
  local_2d8.data._M_elems[5] = local_158[1];
  local_2d8.data._M_elems[6] = auStack_150[0];
  local_2d8.data._M_elems[7] = auStack_150[1];
  local_2d8.data._M_elems[0] = local_168[0];
  local_2d8.data._M_elems[1] = local_168[1];
  uVar7 = local_2d8.data._M_elems._0_8_;
  local_2d8.data._M_elems[2] = auStack_160[0];
  local_2d8.data._M_elems[3] = auStack_160[1];
  local_2d8.exp = iVar16;
  local_2d8.neg = bVar15;
  local_238.fpclass = (fpclass_type)uVar8;
  local_238.prec_elem = SUB84(uVar8,4);
  local_2d8.fpclass = local_238.fpclass;
  local_2d8.prec_elem = local_238.prec_elem;
  if ((bVar15 == true) &&
     (local_2d8.data._M_elems[0] = local_168[0],
     local_2d8.data._M_elems[0] != 0 || local_178 != cpp_dec_float_finite)) {
    local_2d8.neg = false;
  }
  local_2d8.data._M_elems._0_8_ = uVar7;
  local_238._72_8_ = uVar9;
  if (((local_178 != cpp_dec_float_NaN) && (local_d0.fpclass != cpp_dec_float_NaN)) &&
     (iVar16 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_2d8,&local_d0), iVar16 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_238,0.0);
  }
  local_288.data._M_elems[0xc] = local_238.data._M_elems[0xc];
  local_288.data._M_elems[0xd] = local_238.data._M_elems[0xd];
  local_288.data._M_elems._56_5_ = local_238.data._M_elems._56_5_;
  local_288.data._M_elems[0xf]._1_3_ = local_238.data._M_elems[0xf]._1_3_;
  local_288.data._M_elems[8] = local_238.data._M_elems[8];
  local_288.data._M_elems[9] = local_238.data._M_elems[9];
  local_288.data._M_elems[10] = local_238.data._M_elems[10];
  local_288.data._M_elems[0xb] = local_238.data._M_elems[0xb];
  local_288.data._M_elems[4] = local_238.data._M_elems[4];
  local_288.data._M_elems[5] = local_238.data._M_elems[5];
  local_288.data._M_elems[6] = local_238.data._M_elems[6];
  local_288.data._M_elems[7] = local_238.data._M_elems[7];
  local_288.data._M_elems[0] = local_238.data._M_elems[0];
  local_288.data._M_elems[1] = local_238.data._M_elems[1];
  local_288.data._M_elems[2] = local_238.data._M_elems[2];
  local_288.data._M_elems[3] = local_238.data._M_elems[3];
  local_288.exp = local_238.exp;
  local_288.neg = local_238.neg;
  local_288.fpclass = local_238.fpclass;
  local_288.prec_elem = local_238.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_288,&local_1c8)
  ;
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems._56_5_ = 0;
  local_2d8.data._M_elems[0xf]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2d8,&local_288,&local_80);
  iVar16 = this->m_j;
  pnVar5 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = local_2d8.data._M_elems._48_8_;
  *(ulong *)(puVar2 + 2) =
       CONCAT35(local_2d8.data._M_elems[0xf]._1_3_,local_2d8.data._M_elems._56_5_);
  puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = local_2d8.data._M_elems._32_8_;
  *(undefined8 *)(puVar2 + 2) = local_2d8.data._M_elems._40_8_;
  puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_2d8.data._M_elems._16_8_;
  *(undefined8 *)(puVar2 + 2) = local_2d8.data._M_elems._24_8_;
  *(undefined8 *)&pnVar5[iVar16].m_backend.data = local_2d8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2) = local_2d8.data._M_elems._8_8_;
  pnVar5[iVar16].m_backend.exp = local_2d8.exp;
  pnVar5[iVar16].m_backend.neg = local_2d8.neg;
  pnVar5[iVar16].m_backend.fpclass = local_2d8.fpclass;
  pnVar5[iVar16].m_backend.prec_elem = local_2d8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             ((local_1e0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_i),0.0);
  local_2d8.fpclass = cpp_dec_float_finite;
  local_2d8.prec_elem = 0x10;
  local_2d8.data._M_elems[0] = 0;
  local_2d8.data._M_elems[1] = 0;
  local_2d8.data._M_elems[2] = 0;
  local_2d8.data._M_elems[3] = 0;
  local_2d8.data._M_elems[4] = 0;
  local_2d8.data._M_elems[5] = 0;
  local_2d8.data._M_elems[6] = 0;
  local_2d8.data._M_elems[7] = 0;
  local_2d8.data._M_elems[8] = 0;
  local_2d8.data._M_elems[9] = 0;
  local_2d8.data._M_elems[10] = 0;
  local_2d8.data._M_elems[0xb] = 0;
  local_2d8.data._M_elems[0xc] = 0;
  local_2d8.data._M_elems[0xd] = 0;
  local_2d8.data._M_elems._56_5_ = 0;
  local_2d8.data._M_elems[0xf]._1_3_ = 0;
  local_2d8.exp = 0;
  local_2d8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_2d8,0.0);
  iVar16 = (this->m_col).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar16) {
    lVar20 = 0;
    lVar17 = 0;
    do {
      pNVar6 = (this->m_col).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar4 = *(int *)((long)(&pNVar6->val + 1) + lVar20);
      if (iVar4 != this->m_i) {
        pcVar18 = &(y->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar4].m_backend;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)(pNVar6->val).m_backend.data._M_elems + lVar20);
        local_288.fpclass = cpp_dec_float_finite;
        local_288.prec_elem = 0x10;
        local_288.data._M_elems[0] = 0;
        local_288.data._M_elems[1] = 0;
        local_288.data._M_elems[2] = 0;
        local_288.data._M_elems[3] = 0;
        local_288.data._M_elems[4] = 0;
        local_288.data._M_elems[5] = 0;
        local_288.data._M_elems[6] = 0;
        local_288.data._M_elems[7] = 0;
        local_288.data._M_elems[8] = 0;
        local_288.data._M_elems[9] = 0;
        local_288.data._M_elems[10] = 0;
        local_288.data._M_elems[0xb] = 0;
        local_288.data._M_elems[0xc] = 0;
        local_288.data._M_elems[0xd] = 0;
        local_288.data._M_elems._56_5_ = 0;
        local_288.data._M_elems[0xf]._1_3_ = 0;
        local_288.exp = 0;
        local_288.neg = false;
        pcVar19 = pcVar1;
        if ((&local_288 != pcVar18) && (pcVar19 = pcVar18, pcVar1 != &local_288)) {
          local_288.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_288.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_288.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          local_288.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_288.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_288.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
          local_288.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
          uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
          local_288.data._M_elems._56_5_ = SUB85(uVar7,0);
          local_288.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_288.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar20);
          local_288.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar20 + 4);
          local_288._72_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar20 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&local_288,pcVar19);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_2d8,&local_288);
        iVar16 = (this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar17 = lVar17 + 1;
      lVar20 = lVar20 + 0x54;
    } while (lVar17 < iVar16);
  }
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 0x10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.data._M_elems[10] = 0;
  local_288.data._M_elems[0xb] = 0;
  local_288.data._M_elems[0xc] = 0;
  local_288.data._M_elems[0xd] = 0;
  local_288.data._M_elems._56_5_ = 0;
  local_288.data._M_elems[0xf]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  if (&local_288 != &(this->m_obj).m_backend) {
    local_288.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
    local_288.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
    local_288.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
    local_288.data._M_elems._24_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
    local_288.data._M_elems._32_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
    local_288.data._M_elems._40_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 10);
    local_288.data._M_elems._48_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xc);
    uVar7 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xe);
    local_288.data._M_elems._56_5_ = SUB85(uVar7,0);
    local_288.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_288.exp = (this->m_obj).m_backend.exp;
    local_288.neg = (this->m_obj).m_backend.neg;
    local_288.fpclass = (this->m_obj).m_backend.fpclass;
    local_288.prec_elem = (this->m_obj).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_288,&local_2d8)
  ;
  local_238.data._M_elems[0xf]._1_3_ = local_288.data._M_elems[0xf]._1_3_;
  local_238.data._M_elems._56_5_ = local_288.data._M_elems._56_5_;
  local_238.data._M_elems[0] = local_288.data._M_elems[0];
  local_238.data._M_elems[1] = local_288.data._M_elems[1];
  local_238.data._M_elems[2] = local_288.data._M_elems[2];
  local_238.data._M_elems[3] = local_288.data._M_elems[3];
  local_238.data._M_elems[4] = local_288.data._M_elems[4];
  local_238.data._M_elems[5] = local_288.data._M_elems[5];
  local_238.data._M_elems[6] = local_288.data._M_elems[6];
  local_238.data._M_elems[7] = local_288.data._M_elems[7];
  local_238.data._M_elems[8] = local_288.data._M_elems[8];
  local_238.data._M_elems[9] = local_288.data._M_elems[9];
  local_238.data._M_elems[10] = local_288.data._M_elems[10];
  local_238.data._M_elems[0xb] = local_288.data._M_elems[0xb];
  local_238.data._M_elems[0xc] = local_288.data._M_elems[0xc];
  local_238.data._M_elems[0xd] = local_288.data._M_elems[0xd];
  local_238.exp = local_288.exp;
  local_238.neg = local_288.neg;
  local_238.fpclass = local_288.fpclass;
  local_238.prec_elem = local_288.prec_elem;
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 0x10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems[6] = 0;
  local_288.data._M_elems[7] = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.data._M_elems[10] = 0;
  local_288.data._M_elems[0xb] = 0;
  local_288.data._M_elems[0xc] = 0;
  local_288.data._M_elems[0xd] = 0;
  local_288.data._M_elems._56_5_ = 0;
  local_288.data._M_elems[0xf]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_288,&local_238,&local_80);
  iVar16 = this->m_i;
  pnVar5 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = local_288.data._M_elems._48_8_;
  *(ulong *)(puVar2 + 2) =
       CONCAT35(local_288.data._M_elems[0xf]._1_3_,local_288.data._M_elems._56_5_);
  puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = local_288.data._M_elems._32_8_;
  *(undefined8 *)(puVar2 + 2) = local_288.data._M_elems._40_8_;
  puVar2 = pnVar5[iVar16].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
  *(undefined8 *)(puVar2 + 2) = local_288.data._M_elems._24_8_;
  *(undefined8 *)&pnVar5[iVar16].m_backend.data = local_288.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar16].m_backend.data._M_elems + 2) = local_288.data._M_elems._8_8_;
  pnVar5[iVar16].m_backend.exp = local_288.exp;
  pnVar5[iVar16].m_backend.neg = local_288.neg;
  pnVar5[iVar16].m_backend.fpclass = local_288.fpclass;
  pnVar5[iVar16].m_backend.prec_elem = local_288.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             ((local_1d8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  local_1d0->data[this->m_j] = BASIC;
  if (this->m_eqCons == false) {
    if (this->m_onLhs == true) {
      rStatus->data[this->m_i] = ON_LOWER;
    }
    else {
      rStatus->data[this->m_i] = ON_UPPER;
    }
  }
  else {
    rStatus->data[this->m_i] = FIXED;
  }
  return;
}

Assistant:

void SPxMainSM<R>::MultiAggregationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_const, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_const / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = 0.0;

#ifndef NDEBUG

   if(isOptimal && (LT(x[m_j], m_lower, this->feastol()) || GT(x[m_j], m_upper, this->feastol())))
      SPX_MSG_ERROR(std::cerr << "numerical violation in original space due to MultiAggregation\n";)
#endif

      // dual:
      R dualVal = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         dualVal += m_col.value(k) * y[m_col.index(k)];
   }

   z = m_obj - dualVal;

   y[m_i] = z / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}